

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haar_transform.cpp
# Opt level: O0

void anon_unknown.dwarf_1e9d7::directTransform<double>
               (vector<double,_std::allocator<double>_> *input,
               vector<double,_std::allocator<double>_> *output,size_t width,size_t height)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  undefined8 uVar4;
  double *pdVar5;
  double *pdVar6;
  ulong in_RCX;
  ulong in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar7;
  size_t halfHeight;
  double *outputX;
  double *inputXEnd;
  double *inputX;
  double *outputX_1;
  double *inputXEnd_1;
  double *inputX_1;
  size_t halfWidth;
  double *outputY;
  double *inputYEnd;
  double *inputY;
  vector<double,_std::allocator<double>_> temp;
  double coefficient;
  allocator_type *in_stack_ffffffffffffff40;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  imageException *in_stack_ffffffffffffff60;
  double *local_98;
  double *local_90;
  double *local_80;
  double *local_70;
  double *local_60;
  
  bVar1 = std::vector<double,_std::allocator<double>_>::empty
                    ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff40);
  if (!bVar1) {
    sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RDI);
    sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
    if (sVar2 == sVar3) {
      sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RDI);
      if (((sVar3 == in_RDX * in_RCX) && ((in_RDX & 1) == 0)) && ((in_RCX & 1) == 0)) {
        dVar7 = std::sqrt(SUB648(ZEXT464(0x40000000),0));
        dVar7 = (double)(1.0 / SUB84(dVar7,0));
        std::vector<double,_std::allocator<double>_>::size(in_RDI);
        std::allocator<double>::allocator((allocator<double> *)0x1148a7);
        std::vector<double,_std::allocator<double>_>::vector
                  (in_stack_ffffffffffffff50,sVar2,in_stack_ffffffffffffff40);
        std::allocator<double>::~allocator((allocator<double> *)0x1148cd);
        local_60 = std::vector<double,_std::allocator<double>_>::data
                             ((vector<double,_std::allocator<double>_> *)0x1148da);
        pdVar5 = std::vector<double,_std::allocator<double>_>::data
                           ((vector<double,_std::allocator<double>_> *)0x1148ec);
        sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RDI);
        local_70 = std::vector<double,_std::allocator<double>_>::data
                             ((vector<double,_std::allocator<double>_> *)0x11491d);
        for (; local_60 != pdVar5 + sVar2; local_60 = local_60 + in_RDX) {
          local_90 = local_70;
          for (local_80 = local_60; local_80 != local_60 + in_RDX; local_80 = local_80 + 2) {
            *local_90 = (local_80[1] + *local_80) * dVar7;
            local_90[in_RDX >> 1] = (local_80[1] - *local_80) * dVar7;
            local_90 = local_90 + 1;
          }
          local_70 = local_70 + in_RDX;
        }
        local_98 = std::vector<double,_std::allocator<double>_>::data
                             ((vector<double,_std::allocator<double>_> *)0x114a53);
        pdVar5 = std::vector<double,_std::allocator<double>_>::data
                           ((vector<double,_std::allocator<double>_> *)0x114a65);
        pdVar5 = pdVar5 + in_RDX;
        pdVar6 = std::vector<double,_std::allocator<double>_>::data
                           ((vector<double,_std::allocator<double>_> *)0x114a86);
        for (; local_98 != pdVar5; local_98 = local_98 + 1) {
          local_70 = pdVar6;
          for (local_60 = local_98; local_60 != local_98 + in_RCX * in_RDX;
              local_60 = local_60 + in_RDX * 2) {
            *local_70 = (local_60[in_RDX] + *local_60) * dVar7;
            local_70[(in_RCX >> 1) * in_RDX] = (local_60[in_RDX] - *local_60) * dVar7;
            local_70 = local_70 + in_RDX;
          }
          pdVar6 = pdVar6 + 1;
        }
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff40);
        return;
      }
    }
  }
  uVar4 = __cxa_allocate_exception(0x28);
  imageException::imageException(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  __cxa_throw(uVar4,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void directTransform( const std::vector< _Type > & input, std::vector< _Type > & output, size_t width, size_t height )
    {
        if ( input.empty() || input.size() != output.size() || input.size() != width * height || (width % 2) != 0 || (height % 2) != 0 )
            throw imageException( "Incorrect input parameters for Haar direct transform" );

        // Direct Haar Matrix
        // |  1/sqrt(2) 1/sqrt(2) |
        // | -1/sqrt(2) 1/sqrt(2) |

        // Having 2 pixel intensities x and y we would have new values
        // a =  x * (1 / sqrt(2)) + y * (1 / sqrt(2)) = (y + x) * (1 / sqrt(2))
        // b = -x * (1 / sqrt(2)) + y * (1 / sqrt(2)) = (y - x) * (1 / sqrt(2))

        const _Type coefficient = 1.0f / std::sqrt(2.0f);
        std::vector< _Type > temp( input.size() );

        // Transform by X
        const _Type * inputY    = input.data();
        const _Type * inputYEnd = input.data() + input.size();
        _Type       * outputY   = temp.data();

        const size_t halfWidth = width / 2;

        for ( ; inputY != inputYEnd; inputY += width, outputY += width ) {
            const _Type * inputX    = inputY;
            const _Type * inputXEnd = inputX + width;
            _Type       * outputX   = outputY;
            for( ; inputX != inputXEnd; inputX += 2, ++outputX ) {
                *(outputX)             = (*(inputX + 1) + *(inputX)) * coefficient;
                *(outputX + halfWidth) = (*(inputX + 1) - *(inputX)) * coefficient;
            }
        }

        // Transform by Y
        const _Type * inputX    = temp.data();
        const _Type * inputXEnd = temp.data() + width;
        _Type       * outputX   = output.data();

        const size_t halfHeight = (height / 2) * width;

        for ( ; inputX != inputXEnd; ++inputX, ++outputX ) {
            inputY    = inputX;
            inputYEnd = inputX + height * width;
            outputY   = outputX;
            for( ; inputY != inputYEnd; inputY += 2 * width, outputY += width ) {
                *(outputY)              = (*(inputY + width) + *(inputY)) * coefficient;
                *(outputY + halfHeight) = (*(inputY + width) - *(inputY)) * coefficient;
            }
        }
    }